

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O0

int addbyter(int output,FILE *data)

{
  uchar outc;
  nsprintf *infop;
  FILE *data_local;
  int output_local;
  
  if (data->_IO_read_ptr < data->_IO_read_end) {
    **(undefined1 **)data = (char)output;
    *(long *)data = *(long *)data + 1;
    data->_IO_read_ptr = data->_IO_read_ptr + 1;
    data_local._4_4_ = output & 0xff;
  }
  else {
    data_local._4_4_ = 0xffffffff;
  }
  return data_local._4_4_;
}

Assistant:

static int addbyter(int output, FILE *data)
{
  struct nsprintf *infop=(struct nsprintf *)data;
  unsigned char outc = (unsigned char)output;

  if(infop->length < infop->max) {
    /* only do this if we haven't reached max length yet */
    infop->buffer[0] = outc; /* store */
    infop->buffer++; /* increase pointer */
    infop->length++; /* we are now one byte larger */
    return outc;     /* fputc() returns like this on success */
  }
  return -1;
}